

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::Image(Image *this,Image *im)

{
  size_t __size;
  void *pvVar1;
  size_t num_bytes;
  Image *im_local;
  Image *this_local;
  
  this->width = im->width;
  this->height = im->height;
  this->has_alpha = (bool)(im->has_alpha & 1);
  this->channel_width = im->channel_width;
  this->max_value = im->max_value;
  __size = get_data_size(this);
  pvVar1 = malloc(__size);
  (this->data).raw = pvVar1;
  memcpy((this->data).raw,(im->data).raw,__size);
  return;
}

Assistant:

Image::Image(const Image& im)
    : width(im.width),
      height(im.height),
      has_alpha(im.has_alpha),
      channel_width(im.channel_width),
      max_value(im.max_value) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memcpy(this->data.raw, im.data.raw, num_bytes * sizeof(uint8_t));
}